

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int x9_62_create_key_exchange
              (ptls_key_exchange_algorithm_t *algo,ptls_key_exchange_context_t **_ctx)

{
  EC_GROUP *group_00;
  undefined8 *in_RSI;
  long in_RDI;
  int ret;
  st_x9_62_keyex_context_t *ctx;
  EC_GROUP *group;
  uint in_stack_ffffffffffffffd8;
  int iVar1;
  
  group_00 = EC_GROUP_new_by_curve_name((int)*(undefined8 *)(in_RDI + 0x18));
  if (group_00 == (EC_GROUP *)0x0) {
    iVar1 = 0x203;
  }
  else {
    iVar1 = x9_62_create_context
                      ((ptls_key_exchange_algorithm_t *)group,(st_x9_62_keyex_context_t **)ctx);
    if (iVar1 == 0) {
      pERam0000000000000028 = ecdh_gerenate_key((EC_GROUP *)(ulong)in_stack_ffffffffffffffd8);
      if (pERam0000000000000028 == (EC_KEY *)0x0) {
        iVar1 = 0x203;
      }
      else {
        iVar1 = x9_62_setup_pubkey(ctx);
        if (iVar1 == 0) {
          iVar1 = 0;
        }
      }
    }
  }
  if (group_00 != (EC_GROUP *)0x0) {
    EC_GROUP_free(group_00);
  }
  if (iVar1 == 0) {
    *in_RSI = 0;
  }
  else {
    *in_RSI = 0;
  }
  return iVar1;
}

Assistant:

static int x9_62_create_key_exchange(ptls_key_exchange_algorithm_t *algo, ptls_key_exchange_context_t **_ctx)
{
    EC_GROUP *group = NULL;
    struct st_x9_62_keyex_context_t *ctx = NULL;
    int ret;

    /* FIXME use a global? */
    if ((group = EC_GROUP_new_by_curve_name((int)algo->data)) == NULL) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if ((ret = x9_62_create_context(algo, &ctx)) != 0)
        goto Exit;
    if ((ctx->privkey = ecdh_gerenate_key(group)) == NULL) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if ((ret = x9_62_setup_pubkey(ctx)) != 0)
        goto Exit;
    ret = 0;

Exit:
    if (group != NULL)
        EC_GROUP_free(group);
    if (ret == 0) {
        *_ctx = &ctx->super;
    } else {
        if (ctx != NULL)
            x9_62_free_context(ctx);
        *_ctx = NULL;
    }

    return ret;
}